

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::UpdateCoordinates(CEPlanet *this,double new_jd)

{
  double *pdVar1;
  CESkyCoordType CVar2;
  reference pvVar3;
  CESkyCoord *in_RDI;
  double in_XMM0_Qa;
  CEAngle *xcoord;
  double y;
  double x;
  vector<double,_std::allocator<double>_> pos_delayed;
  CEDate date;
  CEPlanet *in_stack_000000d8;
  double *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  CESkyCoord *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  double *in_stack_ffffffffffffff68;
  undefined1 local_88 [8];
  CEAngle *local_80 [3];
  vector<double,_std::allocator<double>_> local_68;
  CESkyCoord local_50;
  double local_10;
  
  if (-1e+29 <= in_XMM0_Qa) {
    pdVar1 = &in_RDI[2].ycoord_.angle_;
    if ((in_XMM0_Qa != *pdVar1) || (NAN(in_XMM0_Qa) || NAN(*pdVar1))) {
      local_10 = in_XMM0_Qa;
      UpdatePosition((CEPlanet *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
      this_00 = &local_50;
      CEDate::CEDate((CEDate *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (double)in_RDI,(CEDateType)((ulong)this_00 >> 0x20));
      PositionICRS_Obs(in_stack_000000d8,(CEDate *)this);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,0);
      iauC2s(pvVar3,local_80,local_88);
      xcoord = (CEAngle *)iauAnp(local_80[0]);
      local_80[0] = xcoord;
      CEAngle::Rad(in_stack_ffffffffffffff68);
      CEAngle::Rad(in_stack_ffffffffffffff68);
      CVar2 = CESkyCoord::GetCoordSystem(in_RDI);
      CESkyCoord::SetCoordinates
                (this_00,xcoord,(CEAngle *)CONCAT44(CVar2,in_stack_ffffffffffffff30),
                 (CESkyCoordType *)in_stack_ffffffffffffff28);
      CEAngle::~CEAngle((CEAngle *)0x166bcc);
      CEAngle::~CEAngle((CEAngle *)0x166bd6);
      in_RDI[2].ycoord_.angle_ = local_10;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this_00);
      CEDate::~CEDate((CEDate *)0x166c03);
    }
  }
  return;
}

Assistant:

void CEPlanet::UpdateCoordinates(double new_jd) const
{
    // If no date was supplied, or if the date hasnt changed, do nothing
    if ((new_jd < -1.0e29) || (new_jd == cached_jd_)) return;

    // Update the positions given the current julian date
    UpdatePosition(new_jd);

    CEDate date(new_jd, CEDateType::JD);
    std::vector<double> pos_delayed = PositionICRS_Obs(date);

    // Now compute the actual sky coordinates in ICRS
    double x;
    double y;
    iauC2s(&pos_delayed[0], &x, &y);
    
    // Make sure the x-coordinate is in the appropriate range
    x = iauAnp(x);

    // Update the coordinates
    CESkyCoord::SetCoordinates(CEAngle::Rad(x), CEAngle::Rad(y), GetCoordSystem());

    // Now that the coordinates are updated, reset the time
    cached_jd_ = new_jd ;
}